

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool cmCTest::ConsoleIsNotDumb(void)

{
  bool bVar1;
  int iVar2;
  bool local_51;
  undefined1 local_30 [8];
  string term_env_variable;
  
  std::__cxx11::string::string((string *)local_30);
  bVar1 = cmsys::SystemTools::GetEnv("TERM",(string *)local_30);
  if (bVar1) {
    iVar2 = isatty(1);
    local_51 = false;
    if (iVar2 != 0) {
      local_51 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_30,"dumb");
    }
    term_env_variable.field_2._M_local_buf[0xf] = local_51;
  }
  else {
    term_env_variable.field_2._M_local_buf[0xf] = '\0';
  }
  std::__cxx11::string::~string((string *)local_30);
  return (bool)(term_env_variable.field_2._M_local_buf[0xf] & 1);
}

Assistant:

bool cmCTest::ConsoleIsNotDumb()
{
  std::string term_env_variable;
  if (cmSystemTools::GetEnv("TERM", term_env_variable)) {
    return isatty(1) && term_env_variable != "dumb";
  }
  return false;
}